

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__instance_physics_model
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  long *in_RSI;
  bool *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  instance_physics_model__AttributeData *attributeData;
  URI *in_stack_fffffffffffffbc8;
  URI *other;
  URI *in_stack_fffffffffffffbd0;
  void **in_stack_fffffffffffffbd8;
  ParserTemplateBase *in_stack_fffffffffffffbe0;
  StringHash in_stack_fffffffffffffbe8;
  ErrorType in_stack_fffffffffffffbf8;
  Severity in_stack_fffffffffffffbfc;
  ParserTemplateBase *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc18;
  URI *in_stack_fffffffffffffc20;
  ParserChar *in_stack_fffffffffffffcb8;
  ParserChar *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  ParserTemplateBase *in_stack_fffffffffffffcd8;
  URI local_320 [2];
  byte local_14d;
  ParserTemplateBase local_140;
  byte local_51;
  ParserChar *local_50;
  StringHash local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  instance_physics_model__AttributeData *local_30;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL15::instance_physics_model__AttributeData>
                       (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a097ad:
    if ((local_30->present_attributes & 1) == 0) {
      in_stack_fffffffffffffbd0 = local_320;
      COLLADABU::URI::URI(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      COLLADABU::URI::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      COLLADABU::URI::~URI(in_stack_fffffffffffffbd0);
    }
    if ((local_30->present_attributes & 2) == 0) {
      other = (URI *)&stack0xfffffffffffffbf8;
      COLLADABU::URI::URI(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      COLLADABU::URI::operator=(in_stack_fffffffffffffbd0,other);
      COLLADABU::URI::~URI(in_stack_fffffffffffffbd0);
    }
    if (((local_30->present_attributes & 1) == 0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                           in_stack_fffffffffffffbf8,(StringHash)in_RDI,in_stack_fffffffffffffbe8,
                           (ParserChar *)in_stack_fffffffffffffbe0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              local_40 = (ParserChar *)*local_38;
              if (local_40 == (ParserChar *)0x0) {
                local_40 = (ParserChar *)0x0;
                goto LAB_00a097ad;
              }
              in_stack_fffffffffffffbe8 = GeneratedSaxParser::Utils::calculateStringHash(local_40);
              if (local_38 + 1 == (undefined8 *)0x0) {
                return false;
              }
              local_50 = (ParserChar *)local_38[1];
              local_38 = local_38 + 2;
              local_48 = in_stack_fffffffffffffbe8;
              if (in_stack_fffffffffffffbe8 != 0x79f4) break;
              local_30->sid = local_50;
            }
            if (in_stack_fffffffffffffbe8 != 0x7c8c) break;
            in_stack_fffffffffffffbe0 = &local_140;
            GeneratedSaxParser::Utils::toURI
                      ((ParserChar **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       in_RDI);
            COLLADABU::URI::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
            COLLADABU::URI::~URI(in_stack_fffffffffffffbd0);
            if (((local_51 & 1) != 0) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                                   in_stack_fffffffffffffbf8,(StringHash)in_RDI,
                                   in_stack_fffffffffffffbe8,(ParserChar *)in_stack_fffffffffffffbe0
                                  ), bVar1)) {
              return false;
            }
            if ((local_51 & 1) == 0) {
              local_30->present_attributes = local_30->present_attributes | 1;
            }
          }
          if (in_stack_fffffffffffffbe8 != 0x74835) break;
          local_30->name = local_50;
        }
        if (in_stack_fffffffffffffbe8 != 0x7688c54) break;
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                   in_RDI);
        COLLADABU::URI::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        COLLADABU::URI::~URI(in_stack_fffffffffffffbd0);
        if (((local_14d & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                               in_stack_fffffffffffffbf8,(StringHash)in_RDI,
                               in_stack_fffffffffffffbe8,(ParserChar *)in_stack_fffffffffffffbe0),
           bVar1)) {
          return false;
        }
        if ((local_14d & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 2;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                         in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                         in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__instance_physics_model( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__instance_physics_model( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

instance_physics_model__AttributeData* attributeData = newData<instance_physics_model__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_URL:
    {
bool failed;
attributeData->url = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INSTANCE_PHYSICS_MODEL,
        HASH_ATTRIBUTE_URL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= instance_physics_model__AttributeData::ATTRIBUTE_URL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INSTANCE_PHYSICS_MODEL,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_PARENT:
    {
bool failed;
attributeData->parent = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INSTANCE_PHYSICS_MODEL,
        HASH_ATTRIBUTE_PARENT,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= instance_physics_model__AttributeData::ATTRIBUTE_PARENT_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INSTANCE_PHYSICS_MODEL, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & instance_physics_model__AttributeData::ATTRIBUTE_URL_PRESENT) == 0)
{
    attributeData->url = COLLADABU::URI("");
}
if ((attributeData->present_attributes & instance_physics_model__AttributeData::ATTRIBUTE_PARENT_PRESENT) == 0)
{
    attributeData->parent = COLLADABU::URI("");
}
if ( (attributeData->present_attributes & instance_physics_model__AttributeData::ATTRIBUTE_URL_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INSTANCE_PHYSICS_MODEL, HASH_ATTRIBUTE_URL, 0 ) )
        return false;
}


    return true;
}